

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void findConstInWhere(WhereConst *pConst,Expr *pExpr)

{
  Expr *pColumn;
  Expr *p;
  int iVar1;
  Expr *pLeft;
  Expr *pRight;
  Expr *pExpr_local;
  WhereConst *pConst_local;
  
  if ((pExpr != (Expr *)0x0) && ((pExpr->flags & pConst->mExcludeOn) == 0)) {
    if (pExpr->op == ',') {
      findConstInWhere(pConst,pExpr->pRight);
      findConstInWhere(pConst,pExpr->pLeft);
    }
    else if (pExpr->op == '5') {
      pColumn = pExpr->pRight;
      p = pExpr->pLeft;
      if ((pColumn->op == 0xa7) && (iVar1 = sqlite3ExprIsConstant(p), iVar1 != 0)) {
        constInsert(pConst,pColumn,p,pExpr);
      }
      if ((p->op == 0xa7) && (iVar1 = sqlite3ExprIsConstant(pColumn), iVar1 != 0)) {
        constInsert(pConst,p,pColumn,pExpr);
      }
    }
  }
  return;
}

Assistant:

static void findConstInWhere(WhereConst *pConst, Expr *pExpr){
  Expr *pRight, *pLeft;
  if( NEVER(pExpr==0) ) return;
  if( ExprHasProperty(pExpr, pConst->mExcludeOn) ){
    testcase( ExprHasProperty(pExpr, EP_OuterON) );
    testcase( ExprHasProperty(pExpr, EP_InnerON) );
    return;
  }
  if( pExpr->op==TK_AND ){
    findConstInWhere(pConst, pExpr->pRight);
    findConstInWhere(pConst, pExpr->pLeft);
    return;
  }
  if( pExpr->op!=TK_EQ ) return;
  pRight = pExpr->pRight;
  pLeft = pExpr->pLeft;
  assert( pRight!=0 );
  assert( pLeft!=0 );
  if( pRight->op==TK_COLUMN && sqlite3ExprIsConstant(pLeft) ){
    constInsert(pConst,pRight,pLeft,pExpr);
  }
  if( pLeft->op==TK_COLUMN && sqlite3ExprIsConstant(pRight) ){
    constInsert(pConst,pLeft,pRight,pExpr);
  }
}